

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O3

TRIPLERGB ** YCbCr2RGB(TRIPLERGB **mrxY,TRIPLERGB **mrxCb,TRIPLERGB **mrxCr,int h,int w)

{
  byte bVar1;
  TRIPLERGB *pTVar2;
  TRIPLERGB *pTVar3;
  TRIPLERGB *pTVar4;
  undefined1 auVar5 [16];
  int iVar6;
  TRIPLERGB **ppTVar7;
  TRIPLERGB *pTVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar10 = (long)h * 8;
  if (h < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  ppTVar7 = (TRIPLERGB **)operator_new__(uVar10);
  if (h != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)w;
    uVar10 = SUB168(auVar5 * ZEXT816(3),0);
    if (SUB168(auVar5 * ZEXT816(3),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    lVar15 = 0;
    do {
      pTVar8 = (TRIPLERGB *)operator_new__(uVar10);
      ppTVar7[lVar15] = pTVar8;
      if (w != 0) {
        pTVar2 = mrxY[lVar15];
        pTVar3 = mrxCb[lVar15];
        pTVar4 = mrxCr[lVar15];
        lVar11 = 2;
        uVar14 = (long)w;
        do {
          dVar18 = (double)(&pTVar2->blue)[lVar11];
          dVar16 = (double)(int)((&pTVar4->blue)[lVar11] - 0x80);
          bVar1 = (&pTVar3->blue)[lVar11];
          dVar17 = round(dVar16 * 1.402 + dVar18);
          dVar19 = (double)(int)(bVar1 - 0x80);
          dVar16 = round(dVar19 * -0.334 + dVar16 * -0.714 + dVar18);
          dVar18 = round(dVar19 * 1.772 + dVar18);
          iVar12 = 0;
          iVar13 = (int)dVar17;
          if ((int)dVar17 < 1) {
            iVar13 = iVar12;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          iVar9 = (int)dVar16;
          if ((int)dVar16 < 1) {
            iVar9 = iVar12;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          iVar6 = (int)dVar18;
          if ((int)dVar18 < 1) {
            iVar6 = iVar12;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          (&pTVar8->blue)[lVar11] = (uchar)iVar13;
          *(char *)((long)pTVar8 + lVar11 + -1) = (char)iVar9;
          *(char *)((long)pTVar8 + lVar11 + -2) = (char)iVar6;
          lVar11 = lVar11 + 3;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != h);
  }
  return ppTVar7;
}

Assistant:

TRIPLERGB **YCbCr2RGB(TRIPLERGB **mrxY, TRIPLERGB **mrxCb, TRIPLERGB **mrxCr, int h, int w) {
    TRIPLERGB **mrxRGBrec = new TRIPLERGB *[h];
    for (size_t i = 0; i < h; i++) {
        mrxRGBrec[i] = new TRIPLERGB[w];
        for (size_t j = 0; j < w; j++) {
            u_char Y = mrxY[i][j].red;
            u_char Cb = mrxCb[i][j].red;
            u_char Cr = mrxCr[i][j].red;
            int R = (int) round(Y + 1.402 * (Cr - 128));
            int G = (int) round(Y - 0.714 * (Cr - 128) - 0.334 * (Cb - 128));
            int B = (int) round(Y + 1.772 * (Cb - 128));
            R = (R > 255) ? 255 : ((R < 0) ? 0 : R);
            G = (G > 255) ? 255 : ((G < 0) ? 0 : G);
            B = (B > 255) ? 255 : ((B < 0) ? 0 : B);
            mrxRGBrec[i][j].red = (u_char) R;
            mrxRGBrec[i][j].green = (u_char) G;
            mrxRGBrec[i][j].blue = (u_char) B;
        }
    }
    return mrxRGBrec;
}